

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PNativeStruct::PNativeStruct(PNativeStruct *this,FName *name)

{
  FName local_14;
  
  PStruct::PStruct(&this->super_PStruct,&local_14,(PTypeBase *)0x0);
  (this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.
  super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006f3e90;
  FString::Format(&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                   mDescriptiveName,"NativeStruct<%s>",FName::NameData.NameArray[name->Index].Text);
  *(undefined4 *)
   &(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.
    super_DObject.field_0x24 = 0;
  (this->super_PStruct).HasNativeFields = true;
  return;
}

Assistant:

PNativeStruct::PNativeStruct(FName name)
	: PStruct(name, nullptr)
{
	mDescriptiveName.Format("NativeStruct<%s>", name.GetChars());
	Size = 0;
	HasNativeFields = true;
}